

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O1

bool __thiscall FTraceInfo::LineCheck(FTraceInfo *this,intercept_t *in,double dist,DVector3 *hit)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  int iVar14;
  ETraceResult EVar15;
  uint uVar16;
  line_t_conflict *plVar17;
  FTraceResults *pFVar18;
  extsector_t *peVar19;
  F3DFloor **ppFVar20;
  F3DFloor *pFVar21;
  bool bVar22;
  bool bVar23;
  uint side;
  ETraceStatus EVar24;
  sector_t_conflict *psVar25;
  BYTE BVar26;
  sector_t_conflict *psVar27;
  secplane_t *psVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  double dVar32;
  double local_88;
  double local_78;
  
  plVar17 = (in->d).line;
  psVar27 = plVar17->frontsector;
  iVar14 = this->CurSector->sectornum;
  side = 0;
  if (psVar27->sectornum != iVar14) {
    psVar25 = plVar17->backsector;
    side = 0;
    if (psVar25 != (sector_t_conflict *)0x0) {
      side = 1;
      if (psVar25->sectornum == iVar14) goto LAB_0045f3b2;
      side = 0;
      if (psVar25 != (sector_t_conflict *)0x0) {
        dVar1 = (this->Start).X;
        dVar2 = (this->Start).Y;
        if (((byte)i_compatflags2 & 8) == 0) {
          side = (uint)(1.52587890625e-05 <
                       ((plVar17->v1->p).X - dVar1) * (plVar17->delta).Y +
                       (dVar2 - (plVar17->v1->p).Y) * (plVar17->delta).X);
        }
        else {
          side = P_VanillaPointOnLineSide(dVar1,dVar2,(line_t *)plVar17);
        }
        psVar27 = (sector_t_conflict *)(&((in->d).thing)->SpriteAngle)[side != 0].Degrees;
      }
    }
    this->CurSector = psVar27;
  }
LAB_0045f3b2:
  plVar17 = (in->d).line;
  if ((plVar17->flags & 4) == 0) {
    psVar27 = (sector_t_conflict *)0x0;
  }
  else {
    psVar27 = (sector_t_conflict *)plVar17->bbox[(ulong)(side == 0) + 4];
    if (((i_compatflags._1_1_ & 0x20) != 0) && (plVar17->backsector == plVar17->frontsector)) {
      if ((this->TraceFlags & 2) != 0) {
        P_ActivateLine(plVar17,this->IgnoreThis,side,0x20,(DVector3 *)0x0);
      }
      if ((this->TraceFlags & 4) != 0) {
        P_ActivateLine((in->d).line,this->IgnoreThis,side,8,(DVector3 *)0x0);
        return true;
      }
      return true;
    }
  }
  psVar25 = this->CurSector;
  dVar1 = hit->X;
  dVar2 = (psVar25->floorplane).normal.X;
  dVar32 = (psVar25->floorplane).D;
  dVar3 = hit->Y;
  dVar4 = (psVar25->floorplane).normal.Y;
  dVar5 = (psVar25->ceilingplane).normal.X;
  dVar6 = (psVar25->ceilingplane).D;
  dVar7 = (psVar25->ceilingplane).normal.Y;
  if (psVar27 == (sector_t_conflict *)0x0) {
    local_88 = 0.0;
    local_78 = 0.0;
  }
  else {
    local_78 = ((psVar27->floorplane).normal.Y * dVar3 +
               (psVar27->floorplane).normal.X * dVar1 + (psVar27->floorplane).D) *
               (psVar27->floorplane).negiC;
    local_88 = (dVar3 * (psVar27->ceilingplane).normal.Y +
               dVar1 * (psVar27->ceilingplane).normal.X + (psVar27->ceilingplane).D) *
               (psVar27->ceilingplane).negiC;
  }
  dVar8 = (psVar25->floorplane).negiC;
  dVar9 = (psVar25->ceilingplane).negiC;
  psVar25 = sector_t::GetHeightSec((sector_t *)psVar25);
  if ((psVar25 != (sector_t_conflict *)0x0) && (this->Results->CrossedWater == (sector_t *)0x0)) {
    dVar10 = (psVar25->floorplane).D;
    dVar11 = (psVar25->floorplane).normal.X;
    dVar12 = (psVar25->floorplane).normal.Y;
    dVar13 = (psVar25->floorplane).negiC;
    if ((((this->Start).Y * dVar12 + (this->Start).X * dVar11 + dVar10) * dVar13 < (this->Start).Z)
       && ((hit->Z <= dVar13 * (dVar12 * hit->Y + dVar10 + dVar11 * hit->X) &&
           (bVar23 = CheckPlane(this,&psVar25->floorplane), bVar23)))) {
      pFVar18 = this->Results;
      pFVar18->CrossedWater = (sector_t *)(sectors + this->CurSector->sectornum);
      (pFVar18->CrossedWaterPos).Z = (pFVar18->HitPos).Z;
      dVar10 = (pFVar18->HitPos).Y;
      (pFVar18->CrossedWaterPos).X = (pFVar18->HitPos).X;
      (pFVar18->CrossedWaterPos).Y = dVar10;
      pFVar18->Distance = 0.0;
    }
  }
  dVar10 = hit->Z;
  if (dVar10 <= (dVar4 * dVar3 + dVar2 * dVar1 + dVar32) * dVar8) {
    pFVar18 = this->Results;
    pFVar18->HitType = TRACE_HitFloor;
    (pFVar18->HitTexture).texnum = this->CurSector->planes[0].Texture.texnum;
  }
  else if ((dVar7 * dVar3 + dVar5 * dVar1 + dVar6) * dVar9 <= dVar10) {
    pFVar18 = this->Results;
    pFVar18->HitType = TRACE_HitCeiling;
    (pFVar18->HitTexture).texnum = this->CurSector->planes[1].Texture.texnum;
  }
  else {
    if ((((psVar27 == (sector_t_conflict *)0x0) || (dVar10 < local_78)) || (local_88 < dVar10)) ||
       ((((in->d).line)->flags & this->WallMask) != 0)) {
      pFVar18 = this->Results;
      pFVar18->HitType = TRACE_HitWall;
      if (psVar27 == (sector_t_conflict *)0x0) {
        BVar26 = '\0';
      }
      else {
        BVar26 = '\x02';
        if (local_78 < dVar10) {
          BVar26 = local_88 <= dVar10;
        }
      }
      pFVar18->Tier = BVar26;
    }
    else {
      if ((psVar27->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
        memcpy(this->DummySector + this->sectorsel,psVar27,0x218);
        uVar16 = this->sectorsel;
        psVar27 = this->DummySector + (int)uVar16;
        this->sectorsel = uVar16 ^ 1;
        peVar19 = this->DummySector[(int)uVar16].e;
        uVar29 = (ulong)(peVar19->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
        bVar23 = uVar29 == 0;
        if (!bVar23) {
          ppFVar20 = (peVar19->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
          lVar30 = 0;
          do {
            pFVar21 = *(F3DFloor **)((long)ppFVar20 + lVar30);
            bVar22 = true;
            if (((pFVar21->flags & 1) != 0) &&
               ((pFVar21->flags >> 0x1a & 1) != this->inshootthrough)) {
              psVar28 = (pFVar21->top).plane;
              dVar1 = (psVar28->normal).X;
              dVar2 = (psVar28->normal).Y;
              dVar32 = (hit->Y * dVar2 + hit->X * dVar1 + psVar28->D) * psVar28->negiC;
              if (hit->Z <= dVar32) {
                psVar28 = (pFVar21->bottom).plane;
                dVar1 = (psVar28->normal).X;
                dVar2 = (psVar28->normal).Y;
                dVar32 = (hit->Y * dVar2 + hit->X * dVar1 + psVar28->D) * psVar28->negiC;
                if (dVar32 <= hit->Z) {
                  pFVar18 = this->Results;
                  pFVar18->HitType = TRACE_HitWall;
                  pFVar18->Tier = '\x03';
                  pFVar18->ffloor = pFVar21;
                  if (((this->TraceFlags & 4) == 0) || (((in->d).line)->special == 0)) {
                    bVar22 = false;
                  }
                  else {
                    P_ActivateLine((in->d).line,this->IgnoreThis,side,8,(DVector3 *)0x0);
                    bVar22 = false;
                  }
                }
                else {
                  if (ABS(local_88 - dVar32) < 1.52587890625e-05) {
                    dVar3 = this->DummySector[(int)uVar16].centerspot.X;
                    dVar4 = this->DummySector[(int)uVar16].centerspot.Y;
                    uVar31 = -(ulong)(psVar28->negiC * (psVar28->D + dVar1 * dVar3 + dVar2 * dVar4)
                                     < (dVar4 * this->DummySector[(int)uVar16].ceilingplane.normal.Y
                                       + dVar3 * this->DummySector[(int)uVar16].ceilingplane.normal.
                                                 X + this->DummySector[(int)uVar16].ceilingplane.D)
                                       * this->DummySector[(int)uVar16].ceilingplane.negiC);
                    local_88 = (double)(~uVar31 & (ulong)local_88 |
                                       (ulong)(dVar32 + 1.52587890625e-05) & uVar31);
                  }
                  if (dVar32 < local_88) {
                    this->DummySector[(int)uVar16].ceilingplane.normal.Z = (psVar28->normal).Z;
                    this->DummySector[(int)uVar16].ceilingplane.normal.Y = dVar2;
                    this->DummySector[(int)uVar16].ceilingplane.normal.X = dVar1;
                    dVar1 = psVar28->negiC;
                    this->DummySector[(int)uVar16].ceilingplane.D = psVar28->D;
                    this->DummySector[(int)uVar16].ceilingplane.negiC = dVar1;
                    this->DummySector[(int)uVar16].planes[1].Texture.texnum =
                         ((pFVar21->bottom).texture)->texnum;
                    this->DummySector[(int)uVar16].Portals[1] = 0;
                    local_88 = dVar32;
                  }
                }
              }
              else {
                if (ABS(local_78 - dVar32) < 1.52587890625e-05) {
                  dVar3 = this->DummySector[(int)uVar16].centerspot.X;
                  dVar4 = this->DummySector[(int)uVar16].centerspot.Y;
                  uVar31 = -(ulong)((dVar4 * this->DummySector[(int)uVar16].floorplane.normal.Y +
                                    dVar3 * this->DummySector[(int)uVar16].floorplane.normal.X +
                                    this->DummySector[(int)uVar16].floorplane.D) *
                                    this->DummySector[(int)uVar16].floorplane.negiC <
                                   psVar28->negiC * (psVar28->D + dVar1 * dVar3 + dVar2 * dVar4));
                  local_78 = (double)(~uVar31 & (ulong)local_78 |
                                     (ulong)(dVar32 + -1.52587890625e-05) & uVar31);
                }
                if (local_78 < dVar32) {
                  this->DummySector[(int)uVar16].floorplane.normal.Z = (psVar28->normal).Z;
                  this->DummySector[(int)uVar16].floorplane.normal.Y = dVar2;
                  this->DummySector[(int)uVar16].floorplane.normal.X = dVar1;
                  dVar1 = psVar28->negiC;
                  this->DummySector[(int)uVar16].floorplane.D = psVar28->D;
                  this->DummySector[(int)uVar16].floorplane.negiC = dVar1;
                  this->DummySector[(int)uVar16].planes[0].Texture.texnum =
                       ((pFVar21->top).texture)->texnum;
                  this->DummySector[(int)uVar16].Portals[0] = 0;
                  local_78 = dVar32;
                }
              }
            }
            if (!bVar22) break;
            lVar30 = lVar30 + 8;
            bVar23 = uVar29 << 3 == lVar30;
          } while (!bVar23);
        }
        if (!bVar23) goto LAB_0045f6d3;
      }
      this->Results->HitType = TRACE_HitNone;
      if ((this->TraceFlags & 2) != 0) {
        P_ActivateLine((in->d).line,this->IgnoreThis,side,0x20,(DVector3 *)0x0);
      }
    }
    if ((this->TraceFlags & 4) != 0) {
      P_ActivateLine((in->d).line,this->IgnoreThis,side,8,(DVector3 *)0x0);
    }
  }
LAB_0045f6d3:
  EVar15 = this->Results->HitType;
  if (EVar15 != TRACE_HitNone) {
    psVar25 = this->CurSector;
    this->Results->Sector = (sector_t *)(sectors + psVar25->sectornum);
    if (EVar15 != TRACE_HitWall) {
      psVar28 = &psVar25->floorplane;
      if (EVar15 != TRACE_HitFloor) {
        psVar28 = &psVar25->ceilingplane;
      }
      bVar23 = CheckPlane(this,psVar28);
      if (!bVar23) {
        if (psVar27 == (sector_t_conflict *)0x0) {
          pFVar18 = this->Results;
          pFVar18->HitType = TRACE_HitWall;
          pFVar18->Tier = '\0';
        }
        else {
          dVar1 = hit->Z;
          pFVar18 = this->Results;
          if ((dVar1 <= local_78) || (local_88 <= dVar1)) {
            pFVar18->HitType = TRACE_HitWall;
            BVar26 = '\x02';
            if (local_78 < dVar1) {
              BVar26 = local_88 <= dVar1;
            }
            pFVar18->Tier = BVar26;
          }
          else {
            pFVar18->HitType = TRACE_HitNone;
          }
        }
        if ((this->Results->HitType == TRACE_HitWall) && ((this->TraceFlags & 4) != 0)) {
          P_ActivateLine((in->d).line,this->IgnoreThis,side,8,(DVector3 *)0x0);
        }
      }
    }
    pFVar18 = this->Results;
    if (pFVar18->HitType == TRACE_HitWall) {
      (pFVar18->HitPos).Z = hit->Z;
      (pFVar18->HitPos).Y = hit->Y;
      (pFVar18->HitPos).X = hit->X;
      SetSourcePosition(this);
      pFVar18 = this->Results;
      pFVar18->Distance = dist;
      pFVar18->Fraction = in->frac;
      pFVar18->Line = (line_t *)in->d;
      pFVar18->Side = (BYTE)side;
    }
  }
  if ((this->TraceCallback != (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0) &&
     (this->Results->HitType != TRACE_HitNone)) {
    EVar24 = (*this->TraceCallback)(this->Results,this->TraceCallbackData);
    if (EVar24 == TRACE_Stop) {
      return false;
    }
    if (EVar24 == TRACE_Skip) {
      this->Results->HitType = TRACE_HitNone;
    }
    else if (EVar24 == TRACE_Abort) {
      this->Results->HitType = TRACE_HitNone;
      return false;
    }
  }
  if (this->Results->HitType != TRACE_HitNone) {
    return false;
  }
  this->CurSector = psVar27;
  this->EnterDist = dist;
  return true;
}

Assistant:

bool FTraceInfo::LineCheck(intercept_t *in, double dist, DVector3 hit)
{
	int lineside;
	sector_t *entersector;

	double ff, fc, bf = 0, bc = 0;

	if (in->d.line->frontsector->sectornum == CurSector->sectornum)
	{
		lineside = 0;
	}
	else if (in->d.line->backsector && in->d.line->backsector->sectornum == CurSector->sectornum)
	{
		lineside = 1;
	}
	else
	{ // Dammit. Why does Doom have to allow non-closed sectors?
		if (in->d.line->backsector == NULL)
		{
			lineside = 0;
			CurSector = in->d.line->frontsector;
		}
		else
		{
			lineside = P_PointOnLineSide(Start, in->d.line);
			CurSector = lineside ? in->d.line->backsector : in->d.line->frontsector;
		}
	}

	if (!(in->d.line->flags & ML_TWOSIDED))
	{
		entersector = NULL;
	}
	else
	{
		entersector = (lineside == 0) ? in->d.line->backsector : in->d.line->frontsector;

		// For backwards compatibility: Ignore lines with the same sector on both sides.
		// This is the way Doom.exe did it and some WADs (e.g. Alien Vendetta MAP15) need it.
		if (i_compatflags & COMPATF_TRACE && in->d.line->backsector == in->d.line->frontsector)
		{
			// We must check special activation here because the code below is never reached.
			if (TraceFlags & TRACE_PCross)
			{
				P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_PCross);
			}
			if (TraceFlags & TRACE_Impact)
			{
				P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_Impact);
			}
			return true;
		}
	}

	ff = CurSector->floorplane.ZatPoint(hit);
	fc = CurSector->ceilingplane.ZatPoint(hit);

	if (entersector != NULL)
	{
		bf = entersector->floorplane.ZatPoint(hit);
		bc = entersector->ceilingplane.ZatPoint(hit);
	}

	sector_t *hsec = CurSector->GetHeightSec();
	if (Results->CrossedWater == NULL &&
		hsec != NULL &&
		Start.Z > hsec->floorplane.ZatPoint(Start) &&
		hit.Z <= hsec->floorplane.ZatPoint(hit))
	{
		// hit crossed a water plane
		if (CheckSectorPlane(hsec, true))
		{
			Results->CrossedWater = &sectors[CurSector->sectornum];
			Results->CrossedWaterPos = Results->HitPos;
			Results->Distance = 0;
		}
	}

	if (hit.Z <= ff)
	{
		// hit floor in front of wall
		Results->HitType = TRACE_HitFloor;
		Results->HitTexture = CurSector->GetTexture(sector_t::floor);
	}
	else if (hit.Z >= fc)
	{
		// hit ceiling in front of wall
		Results->HitType = TRACE_HitCeiling;
		Results->HitTexture = CurSector->GetTexture(sector_t::ceiling);
	}
	else if (entersector == NULL ||
		hit.Z < bf || hit.Z > bc ||
		in->d.line->flags & WallMask)
	{
		// hit the wall
		Results->HitType = TRACE_HitWall;
		Results->Tier =
			entersector == NULL ? TIER_Middle :
			hit.Z <= bf ? TIER_Lower :
			hit.Z >= bc ? TIER_Upper : TIER_Middle;
		if (TraceFlags & TRACE_Impact)
		{
			P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_Impact);
		}
	}
	else
	{ 	// made it past the wall
		// check for 3D floors first
		if (entersector->e->XFloor.ffloors.Size())
		{
			memcpy(&DummySector[sectorsel], entersector, sizeof(sector_t));
			entersector = &DummySector[sectorsel];
			sectorsel ^= 1;

			for (auto rover : entersector->e->XFloor.ffloors)
			{
				int entershootthrough = !!(rover->flags&FF_SHOOTTHROUGH);

				if (entershootthrough != inshootthrough && rover->flags&FF_EXISTS)
				{
					double ff_bottom = rover->bottom.plane->ZatPoint(hit);
					double ff_top = rover->top.plane->ZatPoint(hit);

					// clip to the part of the sector we are in
					if (hit.Z > ff_top)
					{
						// 3D floor height is the same as the floor height. We need to test a second spot to see if it is above or below
						if (fabs(bf - ff_top) < EQUAL_EPSILON)
						{
							double cf = entersector->floorplane.ZatPoint(entersector->centerspot);
							double ffc = rover->top.plane->ZatPoint(entersector->centerspot);
							if (ffc > cf)
							{
								bf = ff_top - EQUAL_EPSILON;
							}
						}
						
						// above
						if (bf < ff_top)
						{
							entersector->floorplane = *rover->top.plane;
							entersector->SetTexture(sector_t::floor, *rover->top.texture, false);
							entersector->ClearPortal(sector_t::floor);
							bf = ff_top;
						}
					}
					else if (hit.Z < ff_bottom)
					{
						// 3D floor height is the same as the ceiling height. We need to test a second spot to see if it is above or below
						if (fabs(bc - ff_bottom) < EQUAL_EPSILON)
						{
							double cc = entersector->ceilingplane.ZatPoint(entersector->centerspot);
							double fcc = rover->bottom.plane->ZatPoint(entersector->centerspot);
							if (fcc < cc)
							{
								bc = ff_bottom + EQUAL_EPSILON;
							}
						}

						//below
						if (bc > ff_bottom)
						{
							entersector->ceilingplane = *rover->bottom.plane;
							entersector->SetTexture(sector_t::ceiling, *rover->bottom.texture, false);
							entersector->ClearPortal(sector_t::ceiling);
							bc = ff_bottom;
						}
					}
					else
					{
						//hit the edge - equivalent to hitting the wall
						Results->HitType = TRACE_HitWall;
						Results->Tier = TIER_FFloor;
						Results->ffloor = rover;
						if ((TraceFlags & TRACE_Impact) && in->d.line->special)
						{
							P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_Impact);
						}
						goto cont;
					}
				}
			}
		}

		Results->HitType = TRACE_HitNone;
		if (TraceFlags & TRACE_PCross)
		{
			P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_PCross);
		}
		if (TraceFlags & TRACE_Impact)
		{ // This is incorrect for "impact", but Hexen did this, so
		  // we need to as well, for compatibility
			P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_Impact);
		}
	}
cont:

	if (Results->HitType != TRACE_HitNone)
	{
		// We hit something, so figure out where exactly
		Results->Sector = &sectors[CurSector->sectornum];

		if (Results->HitType != TRACE_HitWall &&
			!CheckSectorPlane(CurSector, Results->HitType == TRACE_HitFloor))
		{ // trace is parallel to the plane (or right on it)
			if (entersector == NULL)
			{
				Results->HitType = TRACE_HitWall;
				Results->Tier = TIER_Middle;
			}
			else
			{
				if (hit.Z <= bf || hit.Z >= bc)
				{
					Results->HitType = TRACE_HitWall;
					Results->Tier =
						hit.Z <= bf ? TIER_Lower :
						hit.Z >= bc ? TIER_Upper : TIER_Middle;
				}
				else
				{
					Results->HitType = TRACE_HitNone;
				}
			}
			if (Results->HitType == TRACE_HitWall && TraceFlags & TRACE_Impact)
			{
				P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_Impact);
			}
		}

		if (Results->HitType == TRACE_HitWall)
		{
			Results->HitPos = hit;
			SetSourcePosition();
			Results->Distance = dist;
			Results->Fraction = in->frac;
			Results->Line = in->d.line;
			Results->Side = lineside;
		}
	}

	if (TraceCallback != NULL && Results->HitType != TRACE_HitNone)
	{
		switch (TraceCallback(*Results, TraceCallbackData))
		{
		case TRACE_Stop:	return false;
		case TRACE_Abort:	Results->HitType = TRACE_HitNone; return false;
		case TRACE_Skip:	Results->HitType = TRACE_HitNone; break;
		default:			break;
		}
	}

	if (Results->HitType == TRACE_HitNone)
	{
		CurSector = entersector;
		EnterDist = dist;
		return true;
	}
	else
	{
		return false;
	}
}